

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  streambuf *psVar1;
  int64_t iVar2;
  int64_t exitcode;
  undefined1 local_8530 [8];
  Interpreter interpreter;
  string src;
  stringstream sstr;
  ostream local_3d0 [376];
  undefined1 local_258 [8];
  ifstream fin;
  allocator<char> local_39;
  string local_38 [8];
  string path;
  char **argv_local;
  int argc_local;
  
  __s = argv[1];
  path.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::ifstream::ifstream(local_258,local_38,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)(src.field_2._M_local_buf + 8));
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_3d0,psVar1);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::string((string *)&exitcode,(string *)(interpreter.fastMem + 0x7ff8));
  mocker::ir::Interpreter::Interpreter((Interpreter *)local_8530,(string *)&exitcode);
  std::__cxx11::string::~string((string *)&exitcode);
  iVar2 = mocker::ir::Interpreter::run((Interpreter *)local_8530);
  mocker::ir::Interpreter::~Interpreter((Interpreter *)local_8530);
  std::__cxx11::string::~string((string *)(interpreter.fastMem + 0x7ff8));
  std::__cxx11::stringstream::~stringstream((stringstream *)(src.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_258);
  std::__cxx11::string::~string(local_38);
  return (int)iVar2;
}

Assistant:

int main(int argc, char **argv) {
  std::string path = argv[1];
  std::ifstream fin(path);
  std::stringstream sstr;
  sstr << fin.rdbuf();
  std::string src = sstr.str();

  mocker::ir::Interpreter interpreter(src);
  auto exitcode = interpreter.run();

#ifdef PRINT_EXITCODE
  std::cout << "=============================\nexit: " << exitcode << std::endl;
#else
  return (int)exitcode;
#endif
}